

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O3

float __thiscall
lunasvg::parseNumberOrPercentage
          (lunasvg *this,string_view input,bool allowPercentage,float defaultValue)

{
  bool bVar1;
  float fVar2;
  float local_20;
  float local_1c;
  string_view local_18;
  
  local_18._M_str = (char *)input._M_len;
  local_1c = defaultValue;
  local_18._M_len = (size_t)this;
  bVar1 = parseNumber<float>(&local_18,&local_20);
  if (bVar1) {
    if ((char)input._M_str != '\0') {
      if ((lunasvg *)local_18._M_len == (lunasvg *)0x0) {
        local_18._M_len = 0;
      }
      else if (*local_18._M_str == '%') {
        local_18._M_len = local_18._M_len + -1;
        local_20 = local_20 / 100.0;
      }
      fVar2 = 1.0;
      if (local_20 <= 1.0) {
        fVar2 = local_20;
      }
      local_20 = (float)(~-(uint)(local_20 < 0.0) & (uint)fVar2);
    }
    if ((lunasvg *)local_18._M_len == (lunasvg *)0x0) {
      local_1c = local_20;
    }
  }
  return local_1c;
}

Assistant:

static float parseNumberOrPercentage(std::string_view input, bool allowPercentage, float defaultValue)
{
    float value;
    if(!parseNumber(input, value))
        return defaultValue;
    if(allowPercentage) {
        if(skipDelimiter(input, '%'))
            value /= 100.f;
        value = std::clamp(value, 0.f, 1.f);
    }

    if(!input.empty())
        return defaultValue;
    return value;
}